

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winsock.cpp
# Opt level: O0

string * fs_hostname_abi_cxx11_(void)

{
  size_t __n;
  char *__name;
  size_type __len;
  string *in_RDI;
  string_view local_80;
  string_view local_70;
  undefined4 local_5c;
  __sv_type local_58;
  int local_48;
  int ret;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string name;
  
  __n = fs_get_max_path();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,__n,'\0',&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_48 = 0xffffffff;
  __name = (char *)std::__cxx11::string::data();
  __len = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  local_48 = gethostname(__name,__len);
  if (local_48 == 0) {
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    fs_trim_abi_cxx11_(in_RDI,local_58);
  }
  else {
    local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"fs_hostname");
    fs_print_error(local_70,local_80);
    std::__cxx11::string::string((string *)in_RDI);
  }
  local_5c = 1;
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string fs_hostname()
{
  std::string name(fs_get_max_path(), '\0');
  int ret = -1;

#if defined(_WIN32)
  if(WSADATA wsaData; !WSAStartup(MAKEWORD(2, 0), &wsaData)){
    ret = gethostname(name.data(), static_cast<int>(name.size()));
    WSACleanup();
  }

#else
  ret = gethostname(name.data(), name.size());
#endif

  if (ret == 0)
    return fs_trim(name);

  fs_print_error(name, __func__);
  return {};
}